

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

bool __thiscall
slang::parsing::Preprocessor::evalConditionalExpr
          (Preprocessor *this,ConditionalDirectiveExpressionSyntax *expr)

{
  group_type_pointer pgVar1;
  short sVar2;
  SyntaxKind SVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  int iVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  uint uVar15;
  uint64_t uVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  ulong uVar20;
  BinaryConditionalDirectiveExpressionSyntax *bcde;
  undefined1 auVar21 [16];
  string_view local_40;
  
  bVar19 = 0;
  while( true ) {
    for (; SVar3 = ((SyntaxNode *)&(expr->super_SyntaxNode).kind)->kind,
        SVar3 == ParenthesizedConditionalDirectiveExpression;
        expr = (ConditionalDirectiveExpressionSyntax *)(&expr->super_SyntaxNode)[1].previewNode) {
    }
    if (SVar3 == BinaryConditionalDirectiveExpression) {
      bVar14 = evalConditionalExpr(this,*(ConditionalDirectiveExpressionSyntax **)
                                         (&expr->super_SyntaxNode + 1));
      bVar12 = evalConditionalExpr(this,*(ConditionalDirectiveExpressionSyntax **)
                                         (&expr->super_SyntaxNode + 2));
      sVar2 = *(short *)&(&expr->super_SyntaxNode)[1].parent;
      if (sVar2 == 0x26) {
        bVar14 = !bVar14;
      }
      else {
        if (sVar2 == 0x50) {
          bVar14 = bVar14 == bVar12;
          goto LAB_001ddee7;
        }
        if (sVar2 != 0x54) {
          bVar14 = bVar14 && bVar12;
          goto LAB_001ddee7;
        }
      }
      bVar14 = (bool)(bVar14 | bVar12);
      goto LAB_001ddee7;
    }
    if (SVar3 == NamedConditionalDirectiveExpression) break;
    expr = (ConditionalDirectiveExpressionSyntax *)(&expr->super_SyntaxNode)[1].previewNode;
    bVar19 = bVar19 ^ 1;
  }
  local_40 = Token::valueText((Token *)(&expr->super_SyntaxNode + 1));
  uVar16 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->macros,&local_40);
  uVar17 = uVar16 >> ((byte)(this->macros).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar18 = (uVar16 & 0xff) * 4;
  uVar8 = (&UNK_0042856c)[lVar18];
  uVar9 = (&UNK_0042856d)[lVar18];
  uVar10 = (&UNK_0042856e)[lVar18];
  bVar11 = (&UNK_0042856f)[lVar18];
  uVar20 = 0;
  do {
    pgVar4 = (this->macros).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
             .arrays.groups_;
    pgVar1 = pgVar4 + uVar17;
    bVar13 = pgVar1->m[0xf].n;
    auVar21[0] = -(pgVar1->m[0].n == uVar8);
    auVar21[1] = -(pgVar1->m[1].n == uVar9);
    auVar21[2] = -(pgVar1->m[2].n == uVar10);
    auVar21[3] = -(pgVar1->m[3].n == bVar11);
    auVar21[4] = -(pgVar1->m[4].n == uVar8);
    auVar21[5] = -(pgVar1->m[5].n == uVar9);
    auVar21[6] = -(pgVar1->m[6].n == uVar10);
    auVar21[7] = -(pgVar1->m[7].n == bVar11);
    auVar21[8] = -(pgVar1->m[8].n == uVar8);
    auVar21[9] = -(pgVar1->m[9].n == uVar9);
    auVar21[10] = -(pgVar1->m[10].n == uVar10);
    auVar21[0xb] = -(pgVar1->m[0xb].n == bVar11);
    auVar21[0xc] = -(pgVar1->m[0xc].n == uVar8);
    auVar21[0xd] = -(pgVar1->m[0xd].n == uVar9);
    auVar21[0xe] = -(pgVar1->m[0xe].n == uVar10);
    auVar21[0xf] = -(bVar13 == bVar11);
    uVar15 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
    if (uVar15 != 0) {
      ppVar5 = (this->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.elements_;
      do {
        iVar7 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
          }
        }
        bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &this->macros,&local_40,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            ((long)&ppVar5[uVar17 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 5)));
        bVar14 = true;
        if (bVar12) goto LAB_001ddee7;
        uVar15 = uVar15 - 1 & uVar15;
      } while (uVar15 != 0);
      bVar13 = pgVar4[uVar17].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar13) == 0) break;
    uVar6 = (this->macros).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
            .arrays.groups_size_mask;
    lVar18 = uVar17 + uVar20;
    uVar20 = uVar20 + 1;
    uVar17 = lVar18 + 1U & uVar6;
  } while (uVar20 <= uVar6);
  bVar14 = false;
LAB_001ddee7:
  return (bool)(bVar19 ^ bVar14);
}

Assistant:

bool Preprocessor::evalConditionalExpr(
    const syntax::ConditionalDirectiveExpressionSyntax& expr) const {

    switch (expr.kind) {
        case SyntaxKind::ParenthesizedConditionalDirectiveExpression:
            return evalConditionalExpr(
                *expr.as<ParenthesizedConditionalDirectiveExpressionSyntax>().operand);
        case SyntaxKind::UnaryConditionalDirectiveExpression:
            // Only one kind of unary operator.
            return !evalConditionalExpr(
                *expr.as<UnaryConditionalDirectiveExpressionSyntax>().operand);
        case SyntaxKind::BinaryConditionalDirectiveExpression: {
            auto& bcde = expr.as<BinaryConditionalDirectiveExpressionSyntax>();
            const bool l = evalConditionalExpr(*bcde.left);
            const bool r = evalConditionalExpr(*bcde.right);
            switch (bcde.op.kind) {
                case TokenKind::DoubleAnd:
                    return l && r;
                case TokenKind::DoubleOr:
                    return l || r;
                case TokenKind::MinusArrow:
                    return !l || r;
                case TokenKind::LessThanMinusArrow:
                    return l == r;
                default:
                    SLANG_UNREACHABLE;
            }
        }
        case SyntaxKind::NamedConditionalDirectiveExpression:
            return macros.find(
                       expr.as<NamedConditionalDirectiveExpressionSyntax>().name.valueText()) !=
                   macros.end();
        default:
            SLANG_UNREACHABLE;
    }
}